

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsreadlna(bstring r,bStream *s,char terminator)

{
  bstring ptVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int len;
  long lVar10;
  uchar *puVar11;
  tagbstring x;
  tagbstring local_40;
  size_t sVar6;
  
  iVar9 = -1;
  if ((((s != (bStream *)0x0) && (ptVar1 = s->buff, r != (bstring)0x0 && ptVar1 != (bstring)0x0)) &&
      (0 < r->mlen)) && ((uint)r->slen <= (uint)r->mlen)) {
    iVar4 = ptVar1->slen;
    iVar3 = balloc(ptVar1,s->maxBuffSz + 1);
    if (iVar3 == 0) {
      local_40.data = s->buff->data;
      local_40.data[iVar4] = terminator;
      lVar2 = 0;
      do {
        lVar10 = lVar2;
        lVar2 = lVar10 + 1;
      } while (local_40.data[lVar10] != terminator);
      if ((int)lVar10 < iVar4) {
        len = (int)(lVar10 + 1);
        local_40.slen = len;
        iVar3 = bconcat(r,&local_40);
        ptVar1 = s->buff;
        ptVar1->slen = iVar4;
        iVar9 = 0;
        if (iVar3 == 0) {
          iVar9 = 0;
          bdelete(ptVar1,0,len);
        }
      }
      else {
        iVar3 = r->slen;
        local_40.slen = iVar4;
        iVar4 = bconcat(r,&local_40);
        if (iVar4 == 0) {
          for (iVar4 = balloc(r,r->slen + s->maxBuffSz + 1); iVar4 == 0;
              iVar4 = balloc(r,s->maxBuffSz + iVar4 + 1)) {
            puVar11 = r->data + r->slen;
            sVar6 = (*s->readFnPtr)(puVar11,1,(long)s->maxBuffSz,s->parm);
            uVar5 = (uint)sVar6;
            if ((int)uVar5 < 1) {
              r->data[r->slen] = '\0';
              s->buff->slen = 0;
              s->isEOF = 1;
              return -(uint)(r->slen == iVar3);
            }
            puVar11[uVar5 & 0x7fffffff] = terminator;
            uVar8 = 0;
            do {
              uVar7 = uVar8;
              uVar8 = uVar7 + 1;
            } while (puVar11[uVar7] != terminator);
            if ((int)uVar7 < (int)uVar5) {
              r->slen = r->slen + (int)uVar8;
              iVar9 = uVar5 - (int)uVar8;
              ptVar1 = s->buff;
              ptVar1->slen = iVar9;
              memcpy(ptVar1->data,puVar11 + (uVar8 & 0xffffffff),(long)iVar9);
              r->data[r->slen] = '\0';
              return 0;
            }
            iVar4 = r->slen + uVar5;
            r->slen = iVar4;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int bsreadlna (bstring r, struct bStream * s, char terminator) {
int i, l, ret, rlo;
char * b;
struct tagbstring x;

	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0 ||
	    r->slen < 0 || r->mlen < r->slen) return BSTR_ERR;
	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (char *) s->buff->data;
	x.data = (unsigned char *) b;

	/* First check if the current buffer holds the terminator */
	b[l] = terminator; /* Set sentinel */
	for (i=0; b[i] != terminator; i++) ;
	if (i < l) {
		x.slen = i + 1;
		ret = bconcat (r, &x);
		s->buff->slen = l;
		if (BSTR_OK == ret) bdelete (s->buff, 0, i + 1);
		return BSTR_OK;
	}

	rlo = r->slen;

	/* If not then just concatenate the entire buffer to the output */
	x.slen = l;
	if (BSTR_OK != bconcat (r, &x)) return BSTR_ERR;

	/* Perform direct in-place reads into the destination to allow for
	   the minimum of data-copies */
	for (;;) {
		if (BSTR_OK != balloc (r, r->slen + s->maxBuffSz + 1))
		    return BSTR_ERR;
		b = (char *) (r->data + r->slen);
		l = (int) s->readFnPtr (b, 1, s->maxBuffSz, s->parm);
		if (l <= 0) {
			r->data[r->slen] = (unsigned char) '\0';
			s->buff->slen = 0;
			s->isEOF = 1;
			/* If nothing was read return with an error message */
			return BSTR_ERR & -(r->slen == rlo);
		}
		b[l] = terminator; /* Set sentinel */
		for (i=0; b[i] != terminator; i++) ;
		if (i < l) break;
		r->slen += l;
	}

	/* Terminator found, push over-read back to buffer */
	i++;
	r->slen += i;
	s->buff->slen = l - i;
	bstr__memcpy (s->buff->data, b + i, l - i);
	r->data[r->slen] = (unsigned char) '\0';
	return BSTR_OK;
}